

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_io.c
# Opt level: O3

void duckdb_je_malloc_write(char *s)

{
  return;
}

Assistant:

void
malloc_write(const char *s) {
#ifdef DEBUG
	if (je_malloc_message != NULL) {
		je_malloc_message(NULL, s);
	} else {
		wrtmessage(NULL, s);
	}
#endif
}